

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaUtil.cpp
# Opt level: O1

DomainSet * consensusDomains(DomainSet *__return_storage_ptr__,WeightedDomainEnsemble *dEnsemble)

{
  pointer *ppDVar1;
  _Rb_tree_header *p_Var2;
  float fVar3;
  pointer pvVar4;
  pointer pDVar5;
  iterator __position;
  pointer pDVar6;
  DomainSet *this;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  reference dSetIdx;
  long lVar10;
  Domain *domain;
  key_type *__k;
  long lVar11;
  pointer pWVar12;
  Intervals ivals;
  DomainSet *dSet;
  PersistenceMap pmap;
  IntervalScheduler scheduler;
  vector<WeightedInterval,_std::allocator<WeightedInterval>_> local_108;
  DomainSet *local_e8;
  Domain local_e0;
  Intervals local_c8;
  _Rb_tree<Domain,_std::pair<const_Domain,_double>,_std::_Select1st<std::pair<const_Domain,_double>_>,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
  local_b0;
  IntervalScheduler local_80;
  
  local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b0._M_impl.super__Rb_tree_header._M_header;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar11 = (long)(dEnsemble->domainSets).
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(dEnsemble->domainSets).
                 super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_e8 = __return_storage_ptr__;
  local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (lVar11 != 0) {
    lVar10 = 0;
    do {
      pvVar4 = (dEnsemble->domainSets).
               super__Vector_base<std::vector<Domain,_std::allocator<Domain>_>,_std::allocator<std::vector<Domain,_std::allocator<Domain>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar5 = *(pointer *)
                ((long)&pvVar4[lVar10].super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl +
                8);
      for (__k = *(key_type **)
                  &pvVar4[lVar10].super__Vector_base<Domain,_std::allocator<Domain>_>._M_impl;
          __k != pDVar5; __k = __k + 1) {
        fVar3 = __k->weight;
        pmVar7 = std::
                 map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
                 ::operator[]((map<Domain,_double,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
                               *)&local_b0,__k);
        *pmVar7 = (double)fVar3;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != (lVar11 >> 3) * -0x5555555555555555);
  }
  local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_finish = (WeightedInterval *)0x0;
  local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (WeightedInterval *)0x0;
  p_Var2 = &local_b0._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_b0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
    p_Var8 = local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      WeightedInterval::WeightedInterval
                ((WeightedInterval *)&local_80,p_Var8[1]._M_color,*(int *)&p_Var8[1]._M_parent,
                 (double)p_Var8[1]._M_right);
      if (local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<WeightedInterval,_std::allocator<WeightedInterval>_>::
        _M_realloc_insert<WeightedInterval>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(WeightedInterval *)&local_80);
      }
      else {
        (local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
         super__Vector_impl_data._M_finish)->start = (undefined4)local_80.n;
        (local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
         super__Vector_impl_data._M_finish)->end = local_80.n._4_4_;
        (local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
         super__Vector_impl_data._M_finish)->score =
             (double)local_80.ivals.
                     super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl
                     .super__Vector_impl_data._M_start;
        local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var2);
  }
  IntervalScheduler::IntervalScheduler(&local_80,&local_108);
  IntervalScheduler::computeSchedule(&local_80);
  this = local_e8;
  (local_e8->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_e8->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_e8->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  IntervalScheduler::extractIntervals(&local_c8,&local_80);
  if (local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pWVar12 = local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      local_e0.start = (size_t)pWVar12->start;
      local_e0.end = (size_t)pWVar12->end;
      __position._M_current =
           (this->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Domain,_std::allocator<Domain>_>::_M_realloc_insert<Domain>
                  (this,__position,&local_e0);
      }
      else {
        (__position._M_current)->weight = local_e0.weight;
        *(undefined4 *)&(__position._M_current)->field_0x14 = local_e0._20_4_;
        (__position._M_current)->start = local_e0.start;
        (__position._M_current)->end = local_e0.end;
        ppDVar1 = &(this->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppDVar1 = *ppDVar1 + 1;
      }
      pWVar12 = pWVar12 + 1;
    } while (pWVar12 !=
             local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar5 = (this->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar6 = (this->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar5 != pDVar6) {
    uVar9 = ((long)pDVar6 - (long)pDVar5 >> 3) * -0x5555555555555555;
    lVar11 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar5,pDVar6,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Domain*,std::vector<Domain,std::allocator<Domain>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pDVar5,pDVar6);
  }
  if (local_80.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.p.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.bestGeneScore.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.bestGeneScore.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.ivals.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.ivals.
                    super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<WeightedInterval,_std::allocator<WeightedInterval>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<Domain,_std::pair<const_Domain,_double>,_std::_Select1st<std::pair<const_Domain,_double>_>,_std::less<Domain>,_std::allocator<std::pair<const_Domain,_double>_>_>
  ::~_Rb_tree(&local_b0);
  return this;
}

Assistant:

DomainSet consensusDomains(WeightedDomainEnsemble& dEnsemble) {
    using PersistenceMap = map<Domain, double>;
    PersistenceMap pmap;

    for (auto dSetIdx : boost::irange(size_t{0}, dEnsemble.domainSets.size())) {
        auto& dSet = dEnsemble.domainSets[dSetIdx];
        for (auto& domain : dSet) {
            pmap[domain] = domain.weight;
        }
    }

    Intervals ivals;

    for (auto domainPersistence : pmap) {
        auto domain = domainPersistence.first;
        auto persistence = domainPersistence.second;
        ivals.push_back(WeightedInterval(domain.start, domain.end, persistence));
    }

    IntervalScheduler scheduler(ivals);
    scheduler.computeSchedule();

    DomainSet dSet;
    for (auto ival : scheduler.extractIntervals()) {
        dSet.push_back(Domain(ival.start, ival.end));
    }

    sort(dSet.begin(), dSet.end());

    return dSet;
}